

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetWorldToScreenScale(ON_Viewport *this,ON_3dPoint world_point,double *scale)

{
  bool bVar1;
  double *CameraLocation;
  double *CameraZ;
  ON_3dVector local_70;
  undefined1 local_58 [8];
  ON_3dVector CamZ;
  ON_3dPoint CamLoc;
  double frustum_depth;
  double *scale_local;
  ON_Viewport *this_local;
  
  CamLoc.z = -1.23432101234321e+308;
  if (scale != (double *)0x0) {
    *scale = 0.0;
  }
  bVar1 = IsPerspectiveProjection(this);
  if ((bVar1) && (bVar1 = ON_3dPoint::IsValid(&world_point), bVar1)) {
    CameraLocation = ON_3dPoint::operator_cast_to_double_((ON_3dPoint *)&CamZ.z);
    CameraZ = ON_3dVector::operator_cast_to_double_((ON_3dVector *)local_58);
    bVar1 = GetCameraFrame(this,CameraLocation,(double *)0x0,(double *)0x0,CameraZ);
    if ((!bVar1) || (this->m_frus_near <= 0.0)) {
      return false;
    }
    ON_3dPoint::operator-(&local_70,(ON_3dPoint *)&CamZ.z,&world_point);
    CamLoc.z = ON_3dVector::operator*((ON_3dVector *)local_58,&local_70);
    if (CamLoc.z <= 0.0) {
      CamLoc.z = -1.23432101234321e+308;
    }
  }
  bVar1 = GetWorldToScreenScale(this,CamLoc.z,scale);
  return bVar1;
}

Assistant:

bool ON_Viewport::GetWorldToScreenScale(
  ON_3dPoint world_point,
  double* scale
  ) const
{
  double frustum_depth = ON_UNSET_VALUE;

  if (nullptr != scale)
    *scale = 0.0;

  if (IsPerspectiveProjection() && world_point.IsValid())
  {
    ON_3dPoint CamLoc;
    ON_3dVector CamZ;
    if (!GetCameraFrame(CamLoc, nullptr, nullptr, CamZ) || !(m_frus_near > 0.0))
      return false;
    frustum_depth = CamZ*(CamLoc - world_point);
    if (!(frustum_depth > 0.0))
      frustum_depth = ON_UNSET_VALUE;
  }

  return GetWorldToScreenScale(frustum_depth, scale);
}